

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_prop
                   (string *__return_storage_ptr__,Property *prop,string *prop_name,uint32_t indent)

{
  PrimVar *this;
  AttrMeta *this_00;
  Path *v;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  Type indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar4;
  uint32_t n;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  undefined1 in_R8B;
  string ty;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  indent_00 = prop->_type & ~Attrib;
  if (indent_00 == Relation) {
    print_rel_prop(&ty,prop,prop_name,indent);
    ::std::operator<<(local_1a8,(string *)&ty);
  }
  else {
    if (Attrib < prop->_type) {
      poVar2 = ::std::operator<<(local_1a8,"[Invalid Property] ");
      poVar2 = ::std::operator<<(poVar2,(string *)prop_name);
      ::std::operator<<(poVar2,"\n");
      goto LAB_00236ffa;
    }
    this_00 = &(prop->_attrib)._metas;
    bVar1 = AttrMetas::authored(this_00);
    uVar4 = extraout_EDX;
    if (bVar1) {
LAB_00236b77:
      pprint::Indent_abi_cxx11_(&ty,(pprint *)(ulong)indent,uVar4);
      ::std::operator<<(local_1a8,(string *)&ty);
      ::std::__cxx11::string::_M_dispose();
      if (prop->_has_custom == true) {
        ::std::operator<<(local_1a8,"custom ");
      }
      if ((prop->_attrib)._variability == Uniform) {
        ::std::operator<<(local_1a8,"uniform ");
      }
      ty._M_dataplus._M_p = (pointer)&ty.field_2;
      ty._M_string_length = 0;
      ty.field_2._M_local_buf[0] = '\0';
      Attribute::type_name_abi_cxx11_(&local_1f8,&prop->_attrib);
      ::std::__cxx11::string::operator=((string *)&ty,(string *)&local_1f8);
      ::std::__cxx11::string::_M_dispose();
      poVar2 = ::std::operator<<(local_1a8,(string *)&ty);
      poVar2 = ::std::operator<<(poVar2," ");
      ::std::operator<<(poVar2,(string *)prop_name);
      this = &(prop->_attrib)._var;
      bVar1 = primvar::PrimVar::has_value(this);
      if (bVar1) {
        ::std::operator<<(local_1a8," = ");
        bVar1 = Attribute::is_blocked(&prop->_attrib);
        if (bVar1) {
          ::std::operator<<(local_1a8,"None");
        }
        else {
          indent_00 = Attrib;
          value::pprint_value_abi_cxx11_(&local_1f8,(value *)this,(Value *)0x0,1,(bool)in_R8B);
          ::std::operator<<(local_1a8,(string *)&local_1f8);
          ::std::__cxx11::string::_M_dispose();
        }
      }
      bVar1 = AttrMetas::authored(this_00);
      if (bVar1) {
        poVar2 = ::std::operator<<(local_1a8," (\n");
        print_attr_metas_abi_cxx11_
                  (&local_1f8,(tinyusdz *)this_00,(AttrMeta *)(ulong)(indent + 1),indent_00);
        poVar2 = ::std::operator<<(poVar2,(string *)&local_1f8);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
        poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
        ::std::operator<<(poVar2,")");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::operator<<(local_1a8,"\n");
      ::std::__cxx11::string::_M_dispose();
      uVar4 = extraout_EDX_01;
    }
    else {
      bVar1 = primvar::PrimVar::has_value(&(prop->_attrib)._var);
      uVar4 = extraout_EDX_00;
      if (bVar1) goto LAB_00236b77;
    }
    if ((*(pointer *)
          ((long)&(prop->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data + 8) !=
         (prop->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start) && ((prop->_attrib)._variability != Uniform)) {
      pprint::Indent_abi_cxx11_(&ty,(pprint *)(ulong)indent,uVar4);
      ::std::operator<<(local_1a8,(string *)&ty);
      ::std::__cxx11::string::_M_dispose();
      if (prop->_has_custom == true) {
        ::std::operator<<(local_1a8,"custom ");
      }
      ty._M_dataplus._M_p = (pointer)&ty.field_2;
      ty._M_string_length = 0;
      ty.field_2._M_local_buf[0] = '\0';
      Attribute::type_name_abi_cxx11_(&local_1f8,&prop->_attrib);
      ::std::__cxx11::string::operator=((string *)&ty,(string *)&local_1f8);
      ::std::__cxx11::string::_M_dispose();
      poVar2 = ::std::operator<<(local_1a8,(string *)&ty);
      poVar2 = ::std::operator<<(poVar2," ");
      ::std::operator<<(poVar2,(string *)prop_name);
      ::std::operator<<(local_1a8,".timeSamples");
      ::std::operator<<(local_1a8," = ");
      print_timesamples_abi_cxx11_
                (&local_1f8,(tinyusdz *)&(prop->_attrib)._var._ts,(TimeSamples *)(ulong)indent,
                 indent_00);
      ::std::operator<<(local_1a8,(string *)&local_1f8);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      ::std::__cxx11::string::_M_dispose();
      uVar4 = extraout_EDX_02;
    }
    if ((prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start) goto LAB_00236ffa;
    pprint::Indent_abi_cxx11_(&ty,(pprint *)(ulong)indent,uVar4);
    ::std::operator<<(local_1a8,(string *)&ty);
    ::std::__cxx11::string::_M_dispose();
    if (prop->_has_custom == true) {
      ::std::operator<<(local_1a8,"custom ");
    }
    if ((prop->_attrib)._variability == Uniform) {
      ::std::operator<<(local_1a8,"uniform ");
    }
    ty._M_dataplus._M_p = (pointer)&ty.field_2;
    ty._M_string_length = 0;
    ty.field_2._M_local_buf[0] = '\0';
    Attribute::type_name_abi_cxx11_(&local_1f8,&prop->_attrib);
    ::std::__cxx11::string::operator=((string *)&ty,(string *)&local_1f8);
    ::std::__cxx11::string::_M_dispose();
    poVar2 = ::std::operator<<(local_1a8,(string *)&ty);
    poVar2 = ::std::operator<<(poVar2," ");
    ::std::operator<<(poVar2,(string *)prop_name);
    ::std::operator<<(local_1a8,".connect = ");
    v = (prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start;
    lVar3 = ((long)(prop->_attrib)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar3 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar3 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                        &(prop->_attrib)._paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
  ::std::__cxx11::string::_M_dispose();
LAB_00236ffa:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_prop(const Property &prop, const std::string &prop_name,
                       uint32_t indent) {
  std::stringstream ss;

  if (prop.is_relationship()) {
    ss << print_rel_prop(prop, prop_name, indent);

    // Attribute or AttributeConnection
  } else if (prop.is_attribute()) {
    const Attribute &attr = prop.get_attribute();

    //
    // May print multiple times.
    // e.g.
    // float var = 1.0
    // float var.timeSamples = ...
    // float var.connect = <...>
    //
    // timeSamples and connect cannot have attrMeta
    // 

    if (attr.metas().authored() || attr.has_value()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      if (!attr.has_value()) {
        // Nothing to do
      } else {
        // has value content

        ss << " = ";

        if (attr.is_blocked()) {
          ss << "None";
        } else {
          // default value
          ss << value::pprint_value(attr.get_var().value_raw());
        }
      }

      if (prop.get_attribute().metas().authored()) {
        ss << " (\n"
           << print_attr_metas(prop.get_attribute().metas(), indent + 1)
           << pprint::Indent(indent) << ")";
      }

      ss << "\n";
    }

    if (attr.has_timesamples() && (attr.variability() != Variability::Uniform)) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".timeSamples";

      ss << " = ";

      ss << print_timesamples(attr.get_var().ts_raw(), indent);

      ss << "\n";
    }

    if (attr.has_connections()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".connect = ";

      const std::vector<Path> &paths = attr.connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  } else {
    ss << "[Invalid Property] " << prop_name << "\n";
  }

  return ss.str();
}